

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.c
# Opt level: O3

void mbedtls_debug_print_buf
               (mbedtls_ssl_context *ssl,int level,char *file,int line,char *text,uchar *buf,
               size_t len)

{
  uchar uVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  char local_278 [8];
  char str [512];
  uchar auStack_58 [8];
  char txt [17];
  
  if ((((ssl != (mbedtls_ssl_context *)0x0) && (ssl->conf != (mbedtls_ssl_config *)0x0)) &&
      (ssl->conf->f_dbg != (_func_void_void_ptr_int_char_ptr_int_char_ptr *)0x0)) &&
     (level <= debug_threshold)) {
    unique0x1000038a = file;
    snprintf(local_278,0x200,"dumping \'%s\' (%u bytes)\n",text,len & 0xffffffff);
    (*ssl->conf->f_dbg)(ssl->conf->p_dbg,level,stack0xffffffffffffffc0,line,local_278);
    auStack_58[0] = '\0';
    auStack_58[1] = '\0';
    auStack_58[2] = '\0';
    auStack_58[3] = '\0';
    auStack_58[4] = '\0';
    auStack_58[5] = '\0';
    auStack_58[6] = '\0';
    auStack_58[7] = '\0';
    txt[0] = '\0';
    txt[1] = '\0';
    txt[2] = '\0';
    txt[3] = '\0';
    txt[4] = '\0';
    txt[5] = '\0';
    txt[6] = '\0';
    txt[7] = '\0';
    txt[8] = '\0';
    if (len != 0) {
      uVar3 = 0xfff;
      if (len - 1 < 0xfff) {
        uVar3 = len - 1;
      }
      lVar4 = 0;
      uVar5 = 0;
      do {
        if ((uVar5 & 0xf) == 0) {
          if (uVar5 != 0) {
            snprintf(local_278 + lVar4,0x200 - lVar4,"  %s\n",auStack_58);
            (*ssl->conf->f_dbg)(ssl->conf->p_dbg,level,stack0xffffffffffffffc0,line,local_278);
            auStack_58[0] = '\0';
            auStack_58[1] = '\0';
            auStack_58[2] = '\0';
            auStack_58[3] = '\0';
            auStack_58[4] = '\0';
            auStack_58[5] = '\0';
            auStack_58[6] = '\0';
            auStack_58[7] = '\0';
            txt[0] = '\0';
            txt[1] = '\0';
            txt[2] = '\0';
            txt[3] = '\0';
            txt[4] = '\0';
            txt[5] = '\0';
            txt[6] = '\0';
            txt[7] = '\0';
            txt[8] = '\0';
            lVar4 = 0;
          }
          iVar2 = snprintf(local_278 + lVar4,0x200 - lVar4,"%04x: ",uVar5 & 0xffffffff);
          lVar4 = lVar4 + iVar2;
        }
        iVar2 = snprintf(local_278 + lVar4,0x200 - lVar4," %02x",(ulong)buf[uVar5]);
        lVar4 = iVar2 + lVar4;
        uVar1 = buf[uVar5];
        if (0x5e < (byte)(buf[uVar5] - 0x20)) {
          uVar1 = '.';
        }
        txt[(uVar5 & 0xf) - 8] = uVar1;
        uVar5 = uVar5 + 1;
      } while (uVar3 + 1 != uVar5);
      if (len != 0) {
        if ((uVar3 + 1 & 0xf) != 0) {
          uVar3 = uVar3 + 2;
          do {
            iVar2 = snprintf(local_278 + lVar4,0x200 - lVar4,"   ");
            lVar4 = lVar4 + iVar2;
            uVar5 = uVar3 & 0xf;
            uVar3 = uVar3 + 1;
          } while (uVar5 != 0);
        }
        snprintf(local_278 + lVar4,0x200 - lVar4,"  %s\n",auStack_58);
        (*ssl->conf->f_dbg)(ssl->conf->p_dbg,level,stack0xffffffffffffffc0,line,local_278);
      }
    }
  }
  return;
}

Assistant:

void mbedtls_debug_print_buf(const mbedtls_ssl_context *ssl, int level,
                             const char *file, int line, const char *text,
                             const unsigned char *buf, size_t len)
{
    char str[DEBUG_BUF_SIZE];
    char txt[17];
    size_t i, idx = 0;

    if (NULL == ssl              ||
        NULL == ssl->conf        ||
        NULL == ssl->conf->f_dbg ||
        level > debug_threshold) {
        return;
    }

    mbedtls_snprintf(str + idx, sizeof(str) - idx, "dumping '%s' (%u bytes)\n",
                     text, (unsigned int) len);

    debug_send_line(ssl, level, file, line, str);

    memset(txt, 0, sizeof(txt));
    for (i = 0; i < len; i++) {
        if (i >= 4096) {
            break;
        }

        if (i % 16 == 0) {
            if (i > 0) {
                mbedtls_snprintf(str + idx, sizeof(str) - idx, "  %s\n", txt);
                debug_send_line(ssl, level, file, line, str);

                idx = 0;
                memset(txt, 0, sizeof(txt));
            }

            idx += mbedtls_snprintf(str + idx, sizeof(str) - idx, "%04x: ",
                                    (unsigned int) i);

        }

        idx += mbedtls_snprintf(str + idx, sizeof(str) - idx, " %02x",
                                (unsigned int) buf[i]);
        txt[i % 16] = (buf[i] > 31 && buf[i] < 127) ? buf[i] : '.';
    }

    if (len > 0) {
        for (/* i = i */; i % 16 != 0; i++) {
            idx += mbedtls_snprintf(str + idx, sizeof(str) - idx, "   ");
        }

        mbedtls_snprintf(str + idx, sizeof(str) - idx, "  %s\n", txt);
        debug_send_line(ssl, level, file, line, str);
    }
}